

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

QVariant * __thiscall
StringListModel::data
          (QVariant *__return_storage_ptr__,StringListModel *this,QModelIndex *index,int role)

{
  bool bVar1;
  QString local_60;
  undefined1 local_48 [8];
  QVariant baseData;
  int role_local;
  QModelIndex *index_local;
  StringListModel *this_local;
  
  baseData.d._28_4_ = role;
  ::QStringListModel::data((QModelIndex *)local_48,(int)this);
  QVariant::toString();
  bVar1 = QString::isEmpty(&local_60);
  QString::~QString(&local_60);
  if (bVar1) {
    QVariant::QVariant(__return_storage_ptr__);
  }
  else {
    QVariant::QVariant(__return_storage_ptr__,(QVariant *)local_48);
  }
  QVariant::~QVariant((QVariant *)local_48);
  return __return_storage_ptr__;
}

Assistant:

QVariant data(const QModelIndex &index, int role = Qt::DisplayRole) const override
    {
        const QVariant baseData = QStringListModel::data(index, role);
        if (baseData.toString().isEmpty())
            return QVariant();
        return baseData;
    }